

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_get_mi_info(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  aom_codec_err_t aVar6;
  int *piVar7;
  undefined8 *puVar8;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    piVar7 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = piVar7 + 2;
  }
  iVar2 = *piVar7;
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    piVar7 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = piVar7 + 2;
  }
  iVar3 = *piVar7;
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar8 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar8 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar8 + 1;
  }
  if ((void *)*puVar8 == (void *)0x0) {
    return AOM_CODEC_INVALID_PARAM;
  }
  aVar6 = AOM_CODEC_ERROR;
  if ((ctx->frame_worker != (AVxWorker *)0x0) &&
     (plVar4 = (long *)ctx->frame_worker->data1, plVar4 != (long *)0x0)) {
    if (iVar2 < 0) {
      return AOM_CODEC_INVALID_PARAM;
    }
    lVar5 = *plVar4;
    if (*(int *)(lVar5 + 0x3d74) <= iVar2) {
      return AOM_CODEC_INVALID_PARAM;
    }
    if (iVar3 < 0) {
      return AOM_CODEC_INVALID_PARAM;
    }
    aVar6 = AOM_CODEC_INVALID_PARAM;
    if (iVar3 < *(int *)(lVar5 + 0x3d78)) {
      memcpy((void *)*puVar8,
             *(void **)(*(long *)(lVar5 + 0x3d98) +
                       (long)(iVar2 * *(int *)(lVar5 + 0x3da4) + iVar3) * 8),0xb0);
      aVar6 = AOM_CODEC_OK;
    }
  }
  return aVar6;
}

Assistant:

static aom_codec_err_t ctrl_get_mi_info(aom_codec_alg_priv_t *ctx,
                                        va_list args) {
  int mi_row = va_arg(args, int);
  int mi_col = va_arg(args, int);
  MB_MODE_INFO *mi = va_arg(args, MB_MODE_INFO *);
  if (mi == NULL) return AOM_CODEC_INVALID_PARAM;
  if (ctx->frame_worker == NULL) return AOM_CODEC_ERROR;
  FrameWorkerData *const frame_worker_data =
      (FrameWorkerData *)ctx->frame_worker->data1;
  if (frame_worker_data == NULL) return AOM_CODEC_ERROR;

  AV1_COMMON *cm = &frame_worker_data->pbi->common;
  const int mi_rows = cm->mi_params.mi_rows;
  const int mi_cols = cm->mi_params.mi_cols;
  const int mi_stride = cm->mi_params.mi_stride;
  const int offset = mi_row * mi_stride + mi_col;

  if (mi_row < 0 || mi_row >= mi_rows || mi_col < 0 || mi_col >= mi_cols) {
    return AOM_CODEC_INVALID_PARAM;
  }

  memcpy(mi, cm->mi_params.mi_grid_base[offset], sizeof(*mi));

  return AOM_CODEC_OK;
}